

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void ym2413_set_mute_mask_emu(void *chip,UINT32 MuteMask)

{
  uint uVar1;
  uint32_t *puVar2;
  long lVar3;
  
  *(undefined4 *)((long)chip + 0xe10) = 0;
  uVar1 = 0;
  puVar2 = MUTE_MASK_MAP;
  for (lVar3 = 0; lVar3 != 0xe; lVar3 = lVar3 + 1) {
    if ((MuteMask >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      uVar1 = uVar1 | *puVar2;
      *(uint *)((long)chip + 0xe10) = uVar1;
    }
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

static void ym2413_set_mute_mask_emu(void *chip, UINT32 MuteMask)
{
	EOPLL *opll = (EOPLL *)chip;
	uint8_t curChn;
	
	opll->mask = 0;
	for (curChn = 0; curChn < 14; curChn ++)
	{
		if ((MuteMask >> curChn) & 0x01)
			opll->mask |= MUTE_MASK_MAP[curChn];
	}
	
	return;
}